

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O3

int sessioncmp(void *av,void *bv)

{
  char *__s1;
  char *__s1_00;
  int iVar1;
  
  __s1 = *av;
  __s1_00 = *bv;
  iVar1 = strcmp(__s1,"Default Settings");
  if (iVar1 == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = strcmp(__s1_00,"Default Settings");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,__s1_00);
      return iVar1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int sessioncmp(const void *av, const void *bv)
{
    const char *a = *(const char *const *) av;
    const char *b = *(const char *const *) bv;

    /*
     * Alphabetical order, except that "Default Settings" is a
     * special case and comes first.
     */
    if (!strcmp(a, "Default Settings"))
        return -1;                     /* a comes first */
    if (!strcmp(b, "Default Settings"))
        return +1;                     /* b comes first */
    /*
     * FIXME: perhaps we should ignore the first & in determining
     * sort order.
     */
    return strcmp(a, b);               /* otherwise, compare normally */
}